

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O3

void __thiscall
EefcFlash::EefcFlash
          (EefcFlash *this,Samba *samba,string *name,uint32_t addr,uint32_t pages,uint32_t size,
          uint32_t planes,uint32_t lockRegions,uint32_t user,uint32_t stack,uint32_t regs,
          bool canBrownout)

{
  Flash::Flash(&this->super_Flash,samba,name,addr,pages,size,planes,lockRegions,user,stack);
  (this->super_Flash)._vptr_Flash = (_func_int **)&PTR__EefcFlash_001188f8;
  *(uint32_t *)&(this->super_Flash).field_0xf4 = regs;
  this->_canBrownout = canBrownout;
  this->_eraseAuto = true;
  if (1 < planes - 1) {
    __assert_fail("planes == 1 || planes == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EefcFlash.cpp"
                  ,0x4e,
                  "EefcFlash::EefcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
                 );
  }
  if (pages < 0x1001) {
    if (lockRegions < 0x101) {
      Samba::writeWord((this->super_Flash)._samba,regs,0x600);
      if (planes == 2) {
        Samba::writeWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 0x200,
                         0x600);
      }
      return;
    }
    __assert_fail("lockRegions <= 256",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EefcFlash.cpp"
                  ,0x50,
                  "EefcFlash::EefcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
                 );
  }
  __assert_fail("pages <= 4096",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Seeed-Studio[P]BOSSA/src/EefcFlash.cpp"
                ,0x4f,
                "EefcFlash::EefcFlash(Samba &, const std::string &, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, bool)"
               );
}

Assistant:

EefcFlash::EefcFlash(Samba& samba,
                     const std::string& name,
                     uint32_t addr,
                     uint32_t pages,
                     uint32_t size,
                     uint32_t planes,
                     uint32_t lockRegions,
                     uint32_t user,
                     uint32_t stack,
                     uint32_t regs,
                     bool canBrownout)
    : Flash(samba, name, addr, pages, size, planes, lockRegions, user, stack),
      _regs(regs), _canBrownout(canBrownout), _eraseAuto(true)
{
    assert(planes == 1 || planes == 2);
    assert(pages <= 4096);
    assert(lockRegions <= 256);

    // SAM3 Errata (FWS must be 6)
    _samba.writeWord(EEFC0_FMR, 0x6 << 8);
    if (planes == 2)
        _samba.writeWord(EEFC1_FMR, 0x6 << 8);
}